

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O2

ssize_t __thiscall DomColorGroup::write(DomColorGroup *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  DomColorRole **ppDVar2;
  DomColorRole *this_00;
  DomColor **ppDVar3;
  DomColor *this_01;
  undefined4 in_register_00000034;
  long lVar4;
  long in_FS_OFFSET;
  QAnyStringView QVar5;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  QVar5.field_0._4_4_ = in_register_00000034;
  QVar5.field_0._0_4_ = __fd;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)((long)__buf + 0x10);
  if (lVar1 == 0) {
    local_50.d = (Data *)0x0;
    local_68.d = (Data *)0x0;
    local_68.ptr = (char16_t *)0x0;
    local_68.size = 0;
    local_50.ptr = L"colorgroup";
    local_50.size = 10;
  }
  else {
    QString::toLower_helper((QString *)&local_50);
  }
  QVar5.m_size = (size_t)local_50.ptr;
  QXmlStreamWriter::writeStartElement(QVar5);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  if (lVar1 == 0) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  }
  ppDVar2 = (this->m_colorRole).d.ptr;
  lVar1 = (this->m_colorRole).d.size;
  for (lVar4 = 0; lVar1 << 3 != lVar4; lVar4 = lVar4 + 8) {
    this_00 = *(DomColorRole **)((long)ppDVar2 + lVar4);
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"colorrole",9);
    DomColorRole::write(this_00,__fd,&local_50,__n);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  ppDVar3 = (this->m_color).d.ptr;
  lVar1 = (this->m_color).d.size;
  for (lVar4 = 0; lVar1 << 3 != lVar4; lVar4 = lVar4 + 8) {
    this_01 = *(DomColor **)((long)ppDVar3 + lVar4);
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"color",5);
    DomColor::write(this_01,__fd,&local_50,__n);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void DomColorGroup::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("colorgroup") : tagName.toLower());

    for (DomColorRole *v : m_colorRole)
        v->write(writer, u"colorrole"_s);

    for (DomColor *v : m_color)
        v->write(writer, u"color"_s);

    writer.writeEndElement();
}